

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

long calculator::toBase<long,2ul>(string *s)

{
  unsigned_long uVar1;
  bitset<32UL> local_1a0;
  stringstream local_198 [8];
  stringstream ss;
  string *s_local;
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::bitset<32ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            ((bitset<32ul> *)&local_1a0,s,0);
  uVar1 = std::bitset<32UL>::to_ulong(&local_1a0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return uVar1;
}

Assistant:

inline T toBase(const std::string& s) {
    std::stringstream ss;
    if (Base == 16)
        ss << std::hex << s;
    else if (Base == 8)
        ss << std::oct << s;
    else if (Base == 2)
        return std::bitset<32>(s).to_ulong();
    T v;
    ss >> v;
    return v;
}